

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mdct.c
# Opt level: O0

void mdct_butterfly_8(ogg_int32_t *x)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  ogg_int32_t r7;
  ogg_int32_t r6;
  ogg_int32_t r5;
  ogg_int32_t r4;
  ogg_int32_t r3;
  ogg_int32_t r2;
  ogg_int32_t r1;
  ogg_int32_t r0;
  ogg_int32_t *x_local;
  
  iVar1 = x[4];
  iVar2 = *x;
  iVar3 = *x;
  iVar4 = x[5];
  iVar5 = x[1];
  iVar6 = x[1];
  iVar7 = x[2];
  iVar8 = x[3];
  *x = (x[6] - x[2]) + (x[5] - iVar6);
  x[1] = (x[7] - x[3]) - (x[4] - iVar3);
  x[2] = (x[6] - x[2]) - (x[5] - iVar6);
  x[3] = (x[7] - x[3]) + (x[4] - iVar3);
  x[4] = (x[6] + iVar7) - (iVar1 + iVar2);
  x[5] = (x[7] + iVar8) - (iVar4 + iVar5);
  x[6] = x[6] + iVar7 + iVar1 + iVar2;
  x[7] = x[7] + iVar8 + iVar4 + iVar5;
  return;
}

Assistant:

STIN void mdct_butterfly_8(DATA_TYPE *x){

  REG_TYPE r0   = x[4] + x[0];
  REG_TYPE r1   = x[4] - x[0];
  REG_TYPE r2   = x[5] + x[1];
  REG_TYPE r3   = x[5] - x[1];
  REG_TYPE r4   = x[6] + x[2];
  REG_TYPE r5   = x[6] - x[2];
  REG_TYPE r6   = x[7] + x[3];
  REG_TYPE r7   = x[7] - x[3];

	   x[0] = r5   + r3;
	   x[1] = r7   - r1;
	   x[2] = r5   - r3;
	   x[3] = r7   + r1;
           x[4] = r4   - r0;
	   x[5] = r6   - r2;
           x[6] = r4   + r0;
	   x[7] = r6   + r2;
	   MB();
}